

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

AInventory * P_DropItem(AActor *source,PClassActor *type,int dropamount,int chance)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  AInventory *inv_00;
  AInventory *inv;
  DVector3 local_38;
  
  if ((type != (PClassActor *)0x0) && (iVar3 = FRandom::operator()(&pr_dropitem), iVar3 <= chance))
  {
    local_38.Z = 0.0;
    if (((byte)i_compatflags & 0x80) == 0) {
      iVar3 = sv_dropstyle.Value;
      if (sv_dropstyle.Value == 0) {
        iVar3 = gameinfo.defaultdropstyle;
      }
      if (iVar3 == 2) {
        local_38.Z = 24.0;
      }
      else {
        local_38.Z = source->Height * 0.5;
      }
    }
    local_38.Z = local_38.Z + (source->__Pos).Z;
    local_38.X = (source->__Pos).X;
    local_38.Y = (source->__Pos).Y;
    inv_00 = (AInventory *)Spawn(type,&local_38,ALLOW_REPLACE);
    if (inv_00 != (AInventory *)0x0) {
      (inv_00->super_AActor).flags.Value = (inv_00->super_AActor).flags.Value & 0xfffdfdff | 0x20000
      ;
      if (((byte)i_compatflags & 0x80) == 0) {
        P_TossItem((AActor *)inv_00);
      }
      bVar2 = DObject::IsKindOf((DObject *)inv_00,AInventory::RegistrationInfo.MyClass);
      if (bVar2) {
        ModifyDropAmount(inv_00,dropamount);
        pbVar1 = (byte *)((long)&inv_00->ItemFlags + 2);
        *pbVar1 = *pbVar1 | 0x40;
        bVar2 = AInventory::CallSpecialDropAction(inv_00,source);
        if (!bVar2) {
          return inv_00;
        }
        (*(inv_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(inv_00);
      }
    }
  }
  return (AInventory *)0x0;
}

Assistant:

AInventory *P_DropItem (AActor *source, PClassActor *type, int dropamount, int chance)
{
	if (type != NULL && pr_dropitem() <= chance)
	{
		AActor *mo;
		double spawnz = 0;

		if (!(i_compatflags & COMPATF_NOTOSSDROPS))
		{
			int style = sv_dropstyle;
			if (style == 0)
			{
				style = gameinfo.defaultdropstyle;
			}
			if (style == 2)
			{
				spawnz = 24;
			}
			else
			{
				spawnz = source->Height / 2;
			}
		}
		mo = Spawn(type, source->PosPlusZ(spawnz), ALLOW_REPLACE);
		if (mo != NULL)
		{
			mo->flags |= MF_DROPPED;
			mo->flags &= ~MF_NOGRAVITY;	// [RH] Make sure it is affected by gravity
			if (!(i_compatflags & COMPATF_NOTOSSDROPS))
			{
				P_TossItem (mo);
			}
			if (mo->IsKindOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *inv = static_cast<AInventory *>(mo);
				ModifyDropAmount(inv, dropamount);
				inv->ItemFlags |= IF_TOSSED;
				if (inv->CallSpecialDropAction (source))
				{
					// The special action indicates that the item should not spawn
					inv->Destroy();
					return NULL;
				}
				return inv;
			}
			// we can't really return an AInventory pointer to a non-inventory item here, can we?
		}
	}
	return NULL;
}